

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

string * flatbuffers::TSGRPCGenerator::GeneratedFileName
                   (string *__return_storage_ptr__,string *path,string *file_name,bool is_interface)

{
  undefined3 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (CONCAT31(in_register_00000009,is_interface) == 0) {
    std::operator+(&local_30,path,file_name);
    std::operator+(__return_storage_ptr__,&local_30,"_grpc.js");
  }
  else {
    std::operator+(&local_30,path,file_name);
    std::operator+(__return_storage_ptr__,&local_30,"_grpc.d.ts");
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string GeneratedFileName(const std::string &path,
                                       const std::string &file_name,
                                       const bool is_interface = false) {
    if (is_interface) return path + file_name + "_grpc.d.ts";
    return path + file_name + "_grpc.js";
  }